

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O2

int domindblast(void)

{
  int *piVar1;
  monst *pmVar2;
  permonst *ppVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  obj *poVar9;
  char *pcVar10;
  monst *mon;
  
  if (u.uen < 10) {
    iVar5 = 0;
    pline("You concentrate but lack the energy to maintain doing so.");
  }
  else {
    u.uen = u.uen + -10;
    iflags.botl = '\x01';
    pline("You concentrate.");
    if ((uarmh == (obj *)0x0) || (uarmh->otyp != 0x4f)) {
      pline("A wave of psychic energy pours out.");
      pmVar2 = level->monlist;
LAB_0020cfe6:
      mon = pmVar2;
      if (mon != (monst *)0x0) {
        pmVar2 = mon->nmon;
        if (0 < mon->mhp) {
          iVar5 = dist2((int)mon->mx,(int)mon->my,(int)u.ux,(int)u.uy);
          if ((iVar5 < 0x41) && ((*(uint *)&mon->field_0x60 >> 0x16 & 1) == 0)) {
            ppVar3 = mon->data;
            if (ppVar3 == mons + 0x32 || (ppVar3 == mons + 0x31 || ppVar3 == mons + 0x1e)) {
              bVar4 = true;
              if ((*(uint *)&mon->field_0x60 >> 0x11 & 1) != 0) {
                uVar6 = mt_random();
                if ((uVar6 & 1) == 0) goto LAB_0020d061;
                goto LAB_0020d09f;
              }
            }
            else {
LAB_0020d061:
              uVar6 = mt_random();
              if (uVar6 % 10 != 0) goto LAB_0020cfe6;
              poVar9 = which_armor(mon,4);
              if (poVar9 == (obj *)0x0) goto LAB_0020cfe6;
              poVar9 = which_armor(mon,4);
              if (poVar9->otyp == 0x4f) goto LAB_0020cfe6;
LAB_0020d09f:
              bVar4 = false;
            }
            pcVar8 = mon_nam(mon);
            pcVar8 = s_suffix(pcVar8);
            pcVar10 = "telepathy";
            if (!bVar4) {
              ppVar3 = mon->data;
              pcVar10 = "mind";
              if (ppVar3 == mons + 0x32) {
                pcVar10 = "latent telepathy";
              }
              if (ppVar3 == mons + 0x31) {
                pcVar10 = "latent telepathy";
              }
              if (ppVar3 == mons + 0x1e) {
                pcVar10 = "latent telepathy";
              }
            }
            pline("You lock in on %s %s.",pcVar8,pcVar10);
            iVar7 = rnd(0xf);
            piVar1 = &mon->mhp;
            iVar5 = *piVar1;
            *piVar1 = *piVar1 - iVar7;
            if (*piVar1 == 0 || SBORROW4(iVar5,iVar7) != *piVar1 < 0) {
              killed(mon);
            }
          }
        }
        goto LAB_0020cfe6;
      }
      iVar5 = 1;
    }
    else {
      pcVar8 = yname(uarmh);
      iVar5 = 0;
      pline("A wave of psychic energy pours out, but it is blocked by %s.",pcVar8);
    }
  }
  return iVar5;
}

Assistant:

int domindblast(void)
{
	struct monst *mtmp, *nmon;

	if (u.uen < 10) {
	    pline("You concentrate but lack the energy to maintain doing so.");
	    return 0;
	}
	u.uen -= 10;
	iflags.botl = 1;

	pline("You concentrate.");
	if (uarmh && uarmh->otyp == TINFOIL_HAT) {
		pline("A wave of psychic energy pours out, but it is blocked by %s.",
		      yname(uarmh));
		return 0;
	}
	pline("A wave of psychic energy pours out.");
	for (mtmp=level->monlist; mtmp; mtmp = nmon) {
		int u_sen;

		nmon = mtmp->nmon;
		if (DEADMONSTER(mtmp))
			continue;
		if (distu(mtmp->mx, mtmp->my) > BOLT_LIM * BOLT_LIM)
			continue;
		if (mtmp->mpeaceful)
			continue;
		u_sen = telepathic(mtmp->data) && !mtmp->mcansee;
		if (u_sen || (telepathic(mtmp->data) && rn2(2)) ||
		    (!rn2(10) && which_armor(mtmp, W_ARMH) &&
		     which_armor(mtmp, W_ARMH)->otyp != TINFOIL_HAT)) {
			pline("You lock in on %s %s.", s_suffix(mon_nam(mtmp)),
				u_sen ? "telepathy" :
				telepathic(mtmp->data) ? "latent telepathy" :
				"mind");
			mtmp->mhp -= rnd(15);
			if (mtmp->mhp <= 0)
				killed(mtmp);
		}
	}
	return 1;
}